

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O0

void __thiscall llbuild::commands::setProgramName(commands *this,StringRef name)

{
  ulong uVar1;
  string local_38;
  undefined1 local_18 [8];
  StringRef name_local;
  
  name_local.Data = name.Data;
  local_18 = (undefined1  [8])this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __assert_fail("programName.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandUtil.cpp"
                  ,0x22,"void llbuild::commands::setProgramName(StringRef)");
  }
  llvm::StringRef::operator_cast_to_string(&local_38,(StringRef *)local_18);
  std::__cxx11::string::operator=((string *)&programName_abi_cxx11_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void commands::setProgramName(StringRef name) {
  assert(programName.empty());
  programName = name;
}